

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_ellipse.cpp
# Opt level: O3

ON_2dVector __thiscall ON_Ellipse::GradientAt(ON_Ellipse *this,ON_2dPoint *p)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ON_2dVector OVar5;
  
  dVar1 = this->radius[0];
  OVar5 = ON_2dVector::ZeroVector;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar2 = this->radius[1];
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      auVar4._0_8_ = p->x + p->x;
      auVar4._8_8_ = p->y + p->y;
      auVar3._8_8_ = dVar2 * dVar2;
      auVar3._0_8_ = dVar1 * dVar1;
      OVar5 = (ON_2dVector)divpd(auVar4,auVar3);
    }
  }
  return OVar5;
}

Assistant:

ON_2dVector ON_Ellipse::GradientAt( 
                 const ON_2dPoint& p // coordinates in plane
                 ) const
{
  ON_2dVector g;
  if ( radius[0] != 0.0 && radius[1] != 0.0 ) {
    g.x = 2.0*p.x/(radius[0]*radius[0]);
    g.y = 2.0*p.y/(radius[1]*radius[1]);
  }
  else {
    g = ON_2dVector::ZeroVector;
  }
  return g;
}